

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O0

float basisu::lanczos3_filter(float t)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  double in_stack_ffffffffffffffe8;
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_8 = -in_XMM0_Da;
  }
  if (3.0 <= local_8) {
    local_4 = 0.0;
  }
  else {
    dVar1 = sinc(in_stack_ffffffffffffffe8);
    dVar2 = sinc(in_stack_ffffffffffffffe8);
    local_4 = clean(dVar1 * dVar2);
  }
  return local_4;
}

Assistant:

static float lanczos3_filter(float t)
	{
		if (t < 0.0f)
			t = -t;

		if (t < 3.0f)
			return clean(sinc(t) * sinc(t / 3.0f));
		else
			return (0.0f);
	}